

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O0

string * FormatISO8601DateTime_abi_cxx11_(int64_t nTime)

{
  type args_2;
  seconds args;
  char *fmt;
  hh_mm_ss<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *in_RDI;
  long in_FS_OFFSET;
  hh_mm_ss<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> hms;
  year_month_day ymd;
  enable_if_t<__is_duration<duration<long,_ratio<86400L>_>_>::value,_time_point<system_clock,_duration<long,_ratio<86400L,_1L>_>_>_>
  days;
  sys_seconds secs;
  long *in_stack_00000100;
  long *in_stack_00000108;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<86400L,_1L>_>_>
  *in_stack_ffffffffffffff08;
  hh_mm_ss<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *in_stack_ffffffffffffff10;
  duration<long,_std::ratio<1L,_1L>_> __d;
  hh_mm_ss<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *args_3;
  hh_mm_ss<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *args_1;
  undefined1 local_2c [4];
  duration local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  args_3 = in_RDI;
  args_1 = in_RDI;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
            ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff08,(long *)0x1f42a0);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::
  time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
              *)in_stack_ffffffffffffff08,(duration *)0x1f42b7);
  local_28.__r = (rep)std::chrono::
                      floor<std::chrono::duration<long,std::ratio<86400l,1l>>,std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1l>>>
                                ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                                  *)in_stack_ffffffffffffff10);
  __d.__r = (rep)local_2c;
  std::chrono::year_month_day::year_month_day
            ((year_month_day *)in_RDI,(sys_days *)in_stack_ffffffffffffff10);
  args_2 = std::chrono::operator-
                     ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                       *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::chrono::hh_mm_ss<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::hh_mm_ss(in_RDI,__d);
  std::chrono::year_month_day::year((year_month_day *)in_stack_ffffffffffffff10);
  std::chrono::year::operator_cast_to_int((year *)in_stack_ffffffffffffff08);
  std::chrono::year_month_day::month((year_month_day *)in_stack_ffffffffffffff10);
  std::chrono::month::operator_cast_to_unsigned_int((month *)in_stack_ffffffffffffff08);
  std::chrono::year_month_day::day((year_month_day *)in_stack_ffffffffffffff10);
  std::chrono::day::operator_cast_to_unsigned_int((day *)in_stack_ffffffffffffff08);
  std::chrono::hh_mm_ss<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::hours
            (in_stack_ffffffffffffff10);
  std::chrono::duration<long,_std::ratio<3600L,_1L>_>::count
            ((duration<long,_std::ratio<3600L,_1L>_> *)in_stack_ffffffffffffff08);
  std::chrono::hh_mm_ss<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::minutes
            (in_stack_ffffffffffffff10);
  std::chrono::duration<long,_std::ratio<60L,_1L>_>::count
            ((duration<long,_std::ratio<60L,_1L>_> *)in_stack_ffffffffffffff08);
  args = std::chrono::hh_mm_ss<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::seconds
                   (in_stack_ffffffffffffff10);
  fmt = (char *)std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                          ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff08);
  tinyformat::format<int,unsigned_int,unsigned_int,long,long,long>
            (fmt,(int *)args.__r,(uint *)args_1,(uint *)args_2.__r,(long *)args_3,in_stack_00000100,
             in_stack_00000108);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (string *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string FormatISO8601DateTime(int64_t nTime)
{
    const std::chrono::sys_seconds secs{std::chrono::seconds{nTime}};
    const auto days{std::chrono::floor<std::chrono::days>(secs)};
    const std::chrono::year_month_day ymd{days};
    const std::chrono::hh_mm_ss hms{secs - days};
    return strprintf("%04i-%02u-%02uT%02i:%02i:%02iZ", signed{ymd.year()}, unsigned{ymd.month()}, unsigned{ymd.day()}, hms.hours().count(), hms.minutes().count(), hms.seconds().count());
}